

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::SmallVectorImpl<llvm::DWARFGdbIndex::TypeUnitEntry>::resize
          (SmallVectorImpl<llvm::DWARFGdbIndex::TypeUnitEntry> *this,size_type N)

{
  ulong uVar1;
  
  uVar1 = (ulong)(this->super_SmallVectorTemplateBase<llvm::DWARFGdbIndex::TypeUnitEntry,_true>).
                 super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::TypeUnitEntry,_void>.
                 super_SmallVectorBase.Size;
  if (uVar1 <= N) {
    if (N <= uVar1) {
      return;
    }
    if ((this->super_SmallVectorTemplateBase<llvm::DWARFGdbIndex::TypeUnitEntry,_true>).
        super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::TypeUnitEntry,_void>.
        super_SmallVectorBase.Capacity < N) {
      SmallVectorBase::grow_pod((SmallVectorBase *)this,this + 1,N,0x18);
      uVar1 = (ulong)(this->super_SmallVectorTemplateBase<llvm::DWARFGdbIndex::TypeUnitEntry,_true>)
                     .super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::TypeUnitEntry,_void>.
                     super_SmallVectorBase.Size;
    }
    if (uVar1 != N) {
      memset((void *)(uVar1 * 0x18 +
                     (long)(this->
                           super_SmallVectorTemplateBase<llvm::DWARFGdbIndex::TypeUnitEntry,_true>).
                           super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::TypeUnitEntry,_void>
                           .super_SmallVectorBase.BeginX),0,
             (((N * 0x18 + uVar1 * -0x18) - 0x18) / 0x18) * 0x18 + 0x18);
    }
  }
  if (N <= (this->super_SmallVectorTemplateBase<llvm::DWARFGdbIndex::TypeUnitEntry,_true>).
           super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::TypeUnitEntry,_void>.
           super_SmallVectorBase.Capacity) {
    (this->super_SmallVectorTemplateBase<llvm::DWARFGdbIndex::TypeUnitEntry,_true>).
    super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::TypeUnitEntry,_void>.super_SmallVectorBase.
    Size = (uint)N;
    return;
  }
  __assert_fail("N <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void resize(size_type N) {
    if (N < this->size()) {
      this->destroy_range(this->begin()+N, this->end());
      this->set_size(N);
    } else if (N > this->size()) {
      if (this->capacity() < N)
        this->grow(N);
      for (auto I = this->end(), E = this->begin() + N; I != E; ++I)
        new (&*I) T();
      this->set_size(N);
    }
  }